

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O3

void __thiscall chrono::ChFunction_Mocap::ChFunction_Mocap(ChFunction_Mocap *this)

{
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Mocap_00b44dc0;
  (this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  Set_samples(this,2);
  this->samp_freq = 50.0;
  this->timetot = (double)this->samples / 50.0;
  return;
}

Assistant:

ChFunction_Mocap::ChFunction_Mocap() {
    Set_samples(2);  // this creates arrays
    Set_samp_freq(50);
}